

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O0

wchar_t rd_monsters_aux(chunk *c)

{
  _Bool _Var1;
  int16_t iVar2;
  char *pcVar3;
  undefined1 local_1c8 [8];
  monster monster_body;
  monster *mon;
  uint16_t limit;
  chunk *pcStack_18;
  wchar_t i;
  chunk *c_local;
  
  if ((player->is_dead & 1U) == 0) {
    pcStack_18 = c;
    rd_u16b((uint16_t *)((long)&mon + 2));
    if (z_info->level_monster_max < mon._2_2_) {
      pcVar3 = format("Too many (%d) monster entries!",(ulong)mon._2_2_);
      note(pcVar3);
      c_local._4_4_ = L'\xffffffff';
    }
    else {
      for (mon._4_4_ = 1; (int)mon._4_4_ < (int)(uint)mon._2_2_; mon._4_4_ = mon._4_4_ + 1) {
        monster_body._408_8_ = local_1c8;
        memset((void *)monster_body._408_8_,0,0x1a0);
        _Var1 = rd_monster(pcStack_18,(monster *)monster_body._408_8_);
        if (!_Var1) {
          pcVar3 = format("Cannot read monster %d",(ulong)mon._4_4_);
          note(pcVar3);
          return L'\xffffffff';
        }
        iVar2 = place_monster(pcStack_18,*(loc_conflict *)(monster_body._408_8_ + 0x14),
                              (monster *)monster_body._408_8_,'\0');
        if ((int)iVar2 != mon._4_4_) {
          pcVar3 = format("Cannot place monster %d",(ulong)mon._4_4_);
          note(pcVar3);
          return L'\xffffffff';
        }
      }
      c_local._4_4_ = L'\0';
    }
  }
  else {
    c_local._4_4_ = L'\0';
  }
  return c_local._4_4_;
}

Assistant:

static int rd_monsters_aux(struct chunk *c)
{
	int i;
	uint16_t limit;

	/* Only if the player's alive */
	if (player->is_dead)
		return 0;

	/* Read the monster count */
	rd_u16b(&limit);
	if (limit > z_info->level_monster_max) {
		note(format("Too many (%d) monster entries!", limit));
		return (-1);
	}

	/* Read the monsters */
	for (i = 1; i < limit; i++) {
		struct monster *mon;
		struct monster monster_body;

		/* Get local monster */
		mon = &monster_body;
		memset(mon, 0, sizeof(*mon));

		/* Read the monster */
		if (!rd_monster(c, mon)) {
			note(format("Cannot read monster %d", i));
			return (-1);
		}

		/* Place monster in dungeon */
		if (place_monster(c, mon->grid, mon, 0) != i) {
			note(format("Cannot place monster %d", i));
			return (-1);
		}
	}

	return 0;
}